

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O0

Result __thiscall
ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
          (Ruckig<3UL,_ruckig::StandardVector,_false> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input,
          OutputParameter<3UL,_ruckig::StandardVector> *output)

{
  double dVar1;
  bool bVar2;
  rep rVar3;
  double dVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  time_point stop;
  size_t old_section;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_30;
  Result result;
  time_point start;
  OutputParameter<3UL,_ruckig::StandardVector> *output_local;
  InputParameter<3UL,_ruckig::StandardVector> *input_local;
  Ruckig<3UL,_ruckig::StandardVector,_false> *this_local;
  
  start.__d.__r = (duration)(duration)output;
  tStack_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  *(undefined1 *)((long)start.__d.__r + 0x139) = 0;
  old_section._4_4_ = Working;
  if (((this->current_input_initialized & 1U) == 0) ||
     (bVar2 = InputParameter<3UL,_ruckig::StandardVector>::operator!=(input,&this->current_input),
     bVar2)) {
    old_section._4_4_ =
         calculate(this,input,(Trajectory<3UL,_ruckig::StandardVector> *)((long)start.__d.__r + 8),
                   (bool *)((long)start.__d.__r + 0x13a));
    if ((old_section._4_4_ != Working) && (old_section._4_4_ != ErrorPositionalLimits)) {
      return old_section._4_4_;
    }
    InputParameter<3UL,_ruckig::StandardVector>::operator=(&this->current_input,input);
    this->current_input_initialized = true;
    *(undefined8 *)((long)start.__d.__r + 0x128) = 0;
    *(undefined1 *)((long)start.__d.__r + 0x139) = 1;
  }
  stop.__d.__r = *(duration *)((long)start.__d.__r + 0x130);
  *(double *)((long)start.__d.__r + 0x128) =
       this->delta_time + *(double *)((long)start.__d.__r + 0x128);
  Trajectory<3UL,_ruckig::StandardVector>::at_time
            ((Trajectory<3UL,_ruckig::StandardVector> *)((long)start.__d.__r + 8),
             *(double *)((long)start.__d.__r + 0x128),(Vector<double> *)((long)start.__d.__r + 200),
             (Vector<double> *)((long)start.__d.__r + 0xe0),
             (Vector<double> *)((long)start.__d.__r + 0xf8),
             (Vector<double> *)((long)start.__d.__r + 0x110),(size_t *)((long)start.__d.__r + 0x130)
            );
  *(bool *)((long)start.__d.__r + 0x138) =
       (ulong)stop.__d.__r < *(ulong *)((long)start.__d.__r + 0x130);
  local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_58.__r = (rep)std::chrono::operator-(&local_48,&stack0xffffffffffffffd0);
  local_50.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_58);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_50);
  *(double *)((long)start.__d.__r + 0x140) = (double)rVar3 / 1000.0;
  OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
            ((OutputParameter<3UL,_ruckig::StandardVector> *)start.__d.__r,&this->current_input);
  dVar1 = *(double *)((long)start.__d.__r + 0x128);
  dVar4 = Trajectory<3UL,_ruckig::StandardVector>::get_duration
                    ((Trajectory<3UL,_ruckig::StandardVector> *)((long)start.__d.__r + 8));
  if (dVar1 <= dVar4) {
    this_local._4_4_ = old_section._4_4_;
  }
  else {
    this_local._4_4_ = Finished;
  }
  return this_local._4_4_;
}

Assistant:

Result update(const InputParameter<DOFs, CustomVector>& input, OutputParameter<DOFs, CustomVector>& output) {
        const auto start = std::chrono::steady_clock::now();

        if constexpr (DOFs == 0 && throw_error) {
            if (degrees_of_freedom != input.degrees_of_freedom || degrees_of_freedom != output.degrees_of_freedom) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        output.new_calculation = false;

        Result result {Result::Working};
        if (!current_input_initialized || input != current_input) {
            result = calculate(input, output.trajectory, output.was_calculation_interrupted);
            if (result != Result::Working && result != Result::ErrorPositionalLimits) {
                return result;
            }

            current_input = input;
            current_input_initialized = true;
            output.time = 0.0;
            output.new_calculation = true;
        }

        const size_t old_section = output.new_section;
        output.time += delta_time;
        output.trajectory.at_time(output.time, output.new_position, output.new_velocity, output.new_acceleration, output.new_jerk, output.new_section);
        output.did_section_change = (output.new_section > old_section);  // Report only forward section changes

        const auto stop = std::chrono::steady_clock::now();
        output.calculation_duration = std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count() / 1000.0;

        output.pass_to_input(current_input);

        if (output.time > output.trajectory.get_duration()) {
            return Result::Finished;
        }

        return result;
    }